

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O3

int Hsh_VecManAdd(Hsh_VecMan_t *p,Vec_Int_t *vVec)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  Vec_Int_t *pVVar11;
  long lVar12;
  ulong uVar13;
  uint *puVar14;
  Vec_Int_t *p_00;
  ulong uVar10;
  
  pVVar11 = p->vTable;
  p_00 = p->vMap;
  uVar7 = p_00->nSize;
  if (pVVar11->nSize < (int)uVar7) {
    uVar13 = (ulong)(pVVar11->nSize * 2 - 1);
    while( true ) {
      do {
        uVar7 = (uint)uVar13;
        uVar9 = uVar7 + 1;
        uVar10 = (ulong)uVar9;
        uVar8 = uVar13 & 1;
        uVar13 = uVar10;
      } while (uVar8 != 0);
      if (uVar9 < 9) break;
      iVar6 = 5;
      while (uVar9 % (iVar6 - 2U) != 0) {
        uVar3 = iVar6 * iVar6;
        iVar6 = iVar6 + 2;
        if (uVar9 < uVar3) goto LAB_0073f07a;
      }
    }
LAB_0073f07a:
    if (pVVar11->nCap < (int)uVar9) {
      if (pVVar11->pArray == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar9 << 2);
      }
      else {
        piVar5 = (int *)realloc(pVVar11->pArray,(long)(int)uVar9 << 2);
      }
      pVVar11->pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar11->nCap = uVar9;
    }
    if (uVar7 < 0x7fffffff) {
      memset(pVVar11->pArray,0xff,uVar10 << 2);
    }
    pVVar11->nSize = uVar9;
    pVVar11 = p->vTable;
    p_00 = p->vMap;
    uVar7 = p_00->nSize;
    if (0 < (int)uVar7) {
      pVVar1 = p->vData;
      piVar5 = p_00->pArray;
      lVar12 = 0;
      do {
        iVar6 = piVar5[lVar12];
        if (((long)iVar6 < 0) || (pVVar1->nSize <= iVar6)) goto LAB_0073f37e;
        piVar5 = pVVar1->pArray + iVar6;
        iVar6 = *piVar5;
        (p->vTemp).nCap = iVar6;
        (p->vTemp).nSize = iVar6;
        (p->vTemp).pArray = piVar5 + 2;
        if ((long)iVar6 < 1) {
          uVar7 = 0;
        }
        else {
          uVar13 = 0;
          uVar7 = 0;
          do {
            uVar7 = uVar7 + (&Hsh_VecManHash_s_Primes)[uVar13 % 7] * (piVar5 + 2)[uVar13];
            uVar13 = uVar13 + 1;
          } while ((long)iVar6 != uVar13);
        }
        uVar13 = (ulong)uVar7 % (ulong)(uint)pVVar11->nSize;
        if (((int)uVar13 < 0) || (pVVar11->nSize <= (int)uVar13)) goto LAB_0073f37e;
        if (p_00->nSize <= lVar12) goto LAB_0073f39d;
        piVar5 = p_00->pArray;
        iVar6 = piVar5[lVar12];
        if (((long)iVar6 < 0) || (pVVar1->nSize <= iVar6)) goto LAB_0073f37e;
        piVar2 = pVVar11->pArray;
        pVVar1->pArray[(long)iVar6 + 1] = piVar2[uVar13];
        piVar2[uVar13] = (int)lVar12;
        lVar12 = lVar12 + 1;
        uVar7 = p_00->nSize;
      } while (lVar12 < (int)uVar7);
    }
  }
  iVar6 = vVec->nSize;
  uVar13 = (ulong)iVar6;
  if ((long)uVar13 < 1) {
    uVar9 = 0;
  }
  else {
    uVar8 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + (&Hsh_VecManHash_s_Primes)[uVar8 % 7] * vVec->pArray[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar13 != uVar8);
  }
  uVar8 = (ulong)uVar9 % (ulong)(uint)pVVar11->nSize;
  iVar4 = (int)uVar8;
  if ((iVar4 < 0) || (pVVar11->nSize <= iVar4)) {
LAB_0073f37e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  puVar14 = (uint *)(pVVar11->pArray + uVar8);
  uVar9 = *puVar14;
  pVVar11 = p->vData;
  if (uVar9 != 0xffffffff) {
    do {
      if (((int)uVar9 < 0) || ((int)uVar7 <= (int)uVar9)) {
LAB_0073f39d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = p_00->pArray[uVar9];
      if (((long)iVar4 < 0) || (pVVar11->nSize <= iVar4)) goto LAB_0073f37e;
      if (pVVar11->pArray == (int *)0x0) break;
      piVar5 = pVVar11->pArray + iVar4;
      if ((*piVar5 == iVar6) && (iVar4 = bcmp(piVar5 + 2,vVec->pArray,uVar13 * 4), iVar4 == 0)) {
        return uVar9;
      }
      uVar9 = piVar5[1];
      puVar14 = (uint *)(piVar5 + 1);
    } while (uVar9 != 0xffffffff);
  }
  *puVar14 = uVar7;
  if ((pVVar11->nSize & 1U) == 0) {
    Vec_IntPush(p_00,pVVar11->nSize);
    Vec_IntPush(p->vData,vVec->nSize);
    Vec_IntPush(p->vData,-1);
    uVar13 = (ulong)(uint)vVec->nSize;
    if (0 < vVec->nSize) {
      lVar12 = 0;
      do {
        Vec_IntPush(p->vData,vVec->pArray[lVar12]);
        lVar12 = lVar12 + 1;
        uVar13 = (ulong)vVec->nSize;
      } while (lVar12 < (long)uVar13);
    }
    if ((uVar13 & 1) != 0) {
      Vec_IntPush(p->vData,-1);
    }
    return p->vMap->nSize + -1;
  }
  __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecHsh.h"
                ,0x216,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
}

Assistant:

static inline int Hsh_VecManAdd( Hsh_VecMan_t * p, Vec_Int_t * vVec )
{
    Hsh_VecObj_t * pObj;
    int i, Ent, * pPlace;
    if ( Vec_IntSize(p->vMap) > Vec_IntSize(p->vTable) )
    {
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), -1 );
        for ( i = 0; i < Vec_IntSize(p->vMap); i++ )
        {
            pPlace = Vec_IntEntryP( p->vTable, Hsh_VecManHash(Hsh_VecReadEntry(p, i), Vec_IntSize(p->vTable)) );
            Hsh_VecObj(p, i)->iNext = *pPlace; *pPlace = i;
        }
    }
    pPlace = Vec_IntEntryP( p->vTable, Hsh_VecManHash(vVec, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hsh_VecObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( pObj->nSize == Vec_IntSize(vVec) && !memcmp( pObj->pArray, Vec_IntArray(vVec), sizeof(int) * (size_t)pObj->nSize ) )
            return *pPlace;
    *pPlace = Vec_IntSize(p->vMap);
    assert( Vec_IntSize(p->vData) % 2 == 0 );
    Vec_IntPush( p->vMap, Vec_IntSize(p->vData) );
    Vec_IntPush( p->vData, Vec_IntSize(vVec) );
    Vec_IntPush( p->vData, -1 );
    Vec_IntForEachEntry( vVec, Ent, i )
        Vec_IntPush( p->vData, Ent );
    if ( Vec_IntSize(vVec) & 1 )
        Vec_IntPush( p->vData, -1 );
    return Vec_IntSize(p->vMap) - 1;
}